

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

uint256 * ComputeTapbranchHash
                    (uint256 *__return_storage_ptr__,Span<const_unsigned_char> a,
                    Span<const_unsigned_char> b)

{
  long lVar1;
  Span<const_unsigned_char> *obj;
  bool bVar2;
  HashWriter *this;
  long lVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  Span<const_unsigned_char> *obj_00;
  long in_FS_OFFSET;
  Span<const_unsigned_char> b_local;
  Span<const_unsigned_char> a_local;
  HashWriter ss_branch;
  
  b_local.m_size = b.m_size;
  b_local.m_data = b.m_data;
  a_local.m_size = a.m_size;
  a_local.m_data = a.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = (uint32_t *)&HASHER_TAPBRANCH;
  puVar5 = (uint32_t *)&ss_branch;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)puVar5 = *(undefined8 *)puVar4;
    puVar4 = puVar4 + 2;
    puVar5 = puVar5 + 2;
  }
  bVar2 = std::__lexicographical_compare<true>::__lc<unsigned_char,unsigned_char>
                    (a_local.m_data,a_local.m_data + a_local.m_size,b_local.m_data,
                     b_local.m_data + b_local.m_size);
  obj_00 = &a_local;
  obj = &b_local;
  if (bVar2) {
    obj_00 = &b_local;
    obj = &a_local;
  }
  this = HashWriter::operator<<(&ss_branch,obj);
  HashWriter::operator<<(this,obj_00);
  HashWriter::GetSHA256(__return_storage_ptr__,&ss_branch);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

uint256 ComputeTapbranchHash(Span<const unsigned char> a, Span<const unsigned char> b)
{
    HashWriter ss_branch{HASHER_TAPBRANCH};
    if (std::lexicographical_compare(a.begin(), a.end(), b.begin(), b.end())) {
        ss_branch << a << b;
    } else {
        ss_branch << b << a;
    }
    return ss_branch.GetSHA256();
}